

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  ThreadPool pool;
  int result;
  _Bind<void_(*(double,_double,_std::reference_wrapper<int>))(int,_int,_int_&)> local_148;
  function<void_()> local_128;
  function<void_()> local_108;
  function<void_()> local_e8;
  function<void_()> local_c8;
  _Any_data local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pool._workers.super__Vector_base<ThreadTask_*,_std::allocator<ThreadTask_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ThreadPool::init(&pool,(EVP_PKEY_CTX *)0x5);
  local_148._M_f = test1;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<int>_>.
  super__Head_base<2UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<int>,_false>)(reference_wrapper<int>)0x100000002;
  std::function<void()>::function<std::_Bind<void(*(int,int))(int,int)>,void>
            ((function<void()> *)&local_c8,(_Bind<void_(*(int,_int))(int,_int)> *)&local_148);
  local_40[1] = (code *)0x0;
  local_40[0] = callback;
  local_28 = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_invoke;
  local_30 = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_manager;
  ThreadPool::add(&pool,&local_c8,(function<void_()> *)local_40);
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::_Function_base::~_Function_base(&local_c8.super__Function_base);
  local_148._M_f = test2;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<int>_>.
  super__Head_base<2UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<int>,_false>)
       (reference_wrapper<int>)0x4000000000000000;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 1.0;
  std::function<void()>::function<std::_Bind<void(*(double,double))(double,double)>,void>
            ((function<void()> *)&local_e8,
             (_Bind<void_(*(double,_double))(double,_double)> *)&local_148);
  local_60[1] = (code *)0x0;
  local_60[0] = callback;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_invoke;
  local_50 = std::_Function_handler<void_(),_std::_Bind<void_(*())()>_>::_M_manager;
  ThreadPool::add(&pool,&local_e8,(function<void_()> *)local_60);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::_Function_base::~_Function_base(&local_e8.super__Function_base);
  local_148._M_f = test2;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<int>_>.
  super__Head_base<2UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<int>,_false>)
       (reference_wrapper<int>)0x4000000000000000;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 1.0;
  std::function<void()>::function<std::_Bind<void(*(double,double))(double,double)>,void>
            ((function<void()> *)&local_108,
             (_Bind<void_(*(double,_double))(double,_double)> *)&local_148);
  local_98 = 0;
  uStack_90 = 0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  ThreadPool::add(&pool,&local_108,(function<void_()> *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Function_base::~_Function_base(&local_108.super__Function_base);
  result = 0;
  local_148._M_f = test3;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 2.0;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 1.0;
  local_148._M_bound_args.super__Tuple_impl<0UL,_double,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<1UL,_double,_std::reference_wrapper<int>_>.
  super__Tuple_impl<2UL,_std::reference_wrapper<int>_>.
  super__Head_base<2UL,_std::reference_wrapper<int>,_false>._M_head_impl._M_data =
       (_Head_base<2UL,_std::reference_wrapper<int>,_false>)
       (_Head_base<2UL,_std::reference_wrapper<int>,_false>)&result;
  std::function<void()>::
  function<std::_Bind<void(*(double,double,std::reference_wrapper<int>))(int,int,int&)>,void>
            ((function<void()> *)&local_128,&local_148);
  local_80._8_8_ = 0;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/EricDDK[P]ThreadPool/test.cpp:37:58)>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/EricDDK[P]ThreadPool/test.cpp:37:58)>
             ::_M_manager;
  local_80._M_unused._M_object = &result;
  ThreadPool::add(&pool,&local_128,(function<void_()> *)&local_80);
  std::_Function_base::~_Function_base((_Function_base *)&local_80);
  std::_Function_base::~_Function_base(&local_128.super__Function_base);
  system("pause");
  ThreadPool::~ThreadPool(&pool);
  return 1;
}

Assistant:

int main()
{
	ThreadPool pool;
	pool.init(5);
	pool.add(std::bind(&test1, 1, 2), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0), std::bind(&callback));
	pool.add(std::bind(&test2, 1.0, 2.0));

	//Add a unit test that asynchronously passes the reference and gets the asynchronous reference result in the callback function.
	int result = 0;
	pool.add(std::bind(&test3, 1.0, 2.0, std::ref(result)), [&]()
	{
		std::cout << "result = " << result << std::endl;
	});

	system("pause");
	return 1;
}